

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void plot_masked_sprite_16px_right(tgestate_t *state,uint8_t x)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte *pbVar13;
  byte bVar14;
  byte bVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  
  bVar6 = x & 3;
  puVar2 = state->bitmap_pointer;
  puVar3 = state->mask_pointer;
  uVar1 = (state->spriteplotter).height_16_left;
  lVar7 = 0;
  do {
    bVar14 = puVar2[lVar7 * 2];
    bVar5 = puVar2[lVar7 * 2 + 1];
    bVar11 = puVar3[lVar7 * 2];
    bVar10 = puVar3[lVar7 * 2 + 1];
    if ((char)state->sprite_index < '\0') {
      uVar16 = (ulong)bVar14;
      uVar18 = (ulong)bVar11;
      bVar11 = state->reversed[bVar10];
      bVar10 = state->reversed[uVar18];
      bVar14 = state->reversed[bVar5];
      bVar5 = state->reversed[uVar16];
    }
    if (bVar6 == 3) {
      bVar15 = (byte)(bVar11 << 7 | bVar10 >> 1) >> 1;
      bVar8 = (bVar11 & 4) << 5 | (byte)((bVar11 & 2) << 6 | bVar15) >> 1;
      bVar15 = (byte)((bVar10 & 1) << 6 | (bVar10 >> 1) << 7 | 0x3e) >> 1 | bVar15 << 7;
      bVar12 = bVar11 >> 3 | 0xe0;
      bVar17 = bVar5 << 7;
      bVar11 = bVar14 >> 1;
      bVar10 = bVar14 << 7 | bVar5 >> 1;
LAB_0010b5f5:
      bVar14 = bVar11 >> 1;
      bVar5 = bVar11 << 7 | bVar10 >> 1;
      bVar11 = bVar10 << 7 | bVar17 >> 1;
LAB_0010b61b:
      bVar17 = bVar5 << 7 | bVar11 >> 1;
      bVar5 = bVar14 << 7 | bVar5 >> 1;
      bVar11 = bVar12;
      bVar10 = bVar8;
LAB_0010b63b:
      bVar14 = bVar14 >> 1;
    }
    else {
      if ((bVar6 ^ 2) < 2) {
        bVar8 = (bVar11 >> 1) + 0x80;
        bVar9 = bVar11 << 7 | bVar10 >> 1;
        bVar15 = bVar10 << 7 | 0x7f;
        if (bVar6 != 0) {
          bVar12 = bVar8 >> 1 | 0x80;
          bVar8 = (bVar11 >> 1) << 7 | bVar9 >> 1;
          bVar15 = bVar15 >> 1 | (bVar10 >> 1) << 7;
          bVar17 = 0;
          bVar11 = bVar14;
          bVar10 = bVar5;
          goto LAB_0010b5f5;
        }
        bVar17 = bVar5 << 7;
        bVar5 = bVar14 << 7 | bVar5 >> 1;
        bVar11 = bVar8;
        bVar10 = bVar9;
        goto LAB_0010b63b;
      }
      if (bVar6 != 0) {
        bVar12 = bVar11 >> 1 | 0x80;
        bVar8 = bVar11 << 7 | bVar10 >> 1;
        bVar15 = bVar10 << 7 | 0x7f;
        bVar11 = 0;
        goto LAB_0010b61b;
      }
      bVar15 = 0xff;
      bVar17 = 0;
    }
    pbVar4 = state->foreground_mask_pointer;
    pbVar13 = state->window_buf_pointer;
    if ((state->spriteplotter).enable_16_left_1 != '\0') {
      *pbVar13 = bVar14 & *pbVar4 | (bVar11 | ~*pbVar4) & *pbVar13;
    }
    if ((state->spriteplotter).enable_16_left_2 != '\0') {
      pbVar13[1] = bVar5 & pbVar4[1] | (bVar10 | ~pbVar4[1]) & pbVar13[1];
    }
    pbVar13 = pbVar13 + 2;
    if ((state->spriteplotter).enable_16_left_3 != '\0') {
      *pbVar13 = bVar17 & pbVar4[2] | (bVar15 | ~pbVar4[2]) & *pbVar13;
    }
    state->foreground_mask_pointer = pbVar4 + 4;
    state->window_buf_pointer = pbVar13 + (long)state->columns + -2;
    lVar7 = lVar7 + 1;
    if (uVar1 == (uint8_t)lVar7) {
      return;
    }
  } while( true );
}

Assistant:

void plot_masked_sprite_16px_right(tgestate_t *state, uint8_t x)
{
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  assert(x < 4);

  ASSERT_MASK_BUF_PTR_VALID(state->foreground_mask_pointer);

  x = (~x & 3); /* jump table offset (on input, x is 0..3) */

  maskptr   = state->mask_pointer;
  bitmapptr = state->bitmap_pointer;

  assert(maskptr   != NULL);
  assert(bitmapptr != NULL);

  iters = state->spriteplotter.height_16_left; /* self modified by $E49D (setup_vischar_plotting) */
  assert(iters <= MASK_BUFFER_HEIGHT * 8);

  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer, 2);
  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer + (iters - 1) * state->columns + 2 - 1, 2);
  do
  {
    uint8_t bm0, bm1, bm2;       /* was D, E, C */
    uint8_t mask0, mask1, mask2; /* was D', E', C' */
    int     carry = 0;

    /* Load bitmap bytes into D,E. */
    bm0 = *bitmapptr++;
    bm1 = *bitmapptr++;

    /* Load mask bytes into D',E'. */
    mask0 = *maskptr++;
    mask1 = *maskptr++;

    if (state->sprite_index & sprite_FLAG_FLIP)
      flip_16_masked_pixels(state, &mask0, &mask1, &bm0, &bm1);

    foremaskptr = state->foreground_mask_pointer;
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* In the 24 pixel-wide plotter it does bitmap rotates THEN mask rotates.
     * Is this the opposite way around to save a bank switch? */

    /* Shift mask bytes */

    mask2 = 0xFF; /* all bits set => mask off */
    carry = 1; /* mask off */
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }
    if (x <= 1)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }
    if (x <= 2)
    {
      RR(mask0);
      RR(mask1);
      RR(mask2);
    }

    /* Shift bitmap bytes */

    bm2 = 0; /* all bits clear => pixels off */
    //carry = 0; in original code but never read in practice
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }
    if (x <= 1)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }
    if (x <= 2)
    {
      SRL(bm0);
      RR(bm1);
      RR(bm2);
    }

    /* Plot, using foreground mask. */

    screenptr = state->window_buf_pointer; // line moved relative to the 24 version
    ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Conv: We form 'mask' inside of the enable_* condition. The original
     * game got away with accessing out-of-bounds memory but we can't. */

    if (state->spriteplotter.enable_16_left_1)
      *screenptr = MASK(bm0, mask0);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_left_2)
      *screenptr = MASK(bm1, mask1);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_left_3)
      *screenptr = MASK(bm2, mask2);
    foremaskptr += 2;
    state->foreground_mask_pointer = foremaskptr;

    screenptr += state->columns - 2; /* was 22 */
    if (iters > 1)
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    state->window_buf_pointer = screenptr;
  }
  while (--iters);
}